

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

size_t ZSTD_decompressSequencesSplitLitBuffer
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  size_t sVar1;
  int nbSeq_local;
  size_t seqSize_local;
  void *seqStart_local;
  size_t maxDstSize_local;
  void *dst_local;
  ZSTD_DCtx *dctx_local;
  
  sVar1 = ZSTD_decompressSequencesSplitLitBuffer_default
                    (dctx,dst,maxDstSize,seqStart,seqSize,nbSeq,isLongOffset,frame);
  return sVar1;
}

Assistant:

static size_t
ZSTD_decompressSequencesSplitLitBuffer(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                                 const void* seqStart, size_t seqSize, int nbSeq,
                                 const ZSTD_longOffset_e isLongOffset,
                                 const int frame)
{
    DEBUGLOG(5, "ZSTD_decompressSequencesSplitLitBuffer");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequencesSplitLitBuffer_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
    }
#endif
    return ZSTD_decompressSequencesSplitLitBuffer_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}